

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O3

int header_newc(archive_read *a,cpio *cpio,archive_entry *entry,size_t *namelength,size_t *name_pad)

{
  byte bVar1;
  cpio *pcVar2;
  int *piVar3;
  char *pcVar4;
  dev_t dVar5;
  int64_t iVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  int *piVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  int *piVar14;
  long lVar15;
  ssize_t bytes;
  long local_50;
  cpio *local_48;
  ulong *local_40;
  ulong *local_38;
  
  local_48 = cpio;
  local_40 = name_pad;
  local_38 = namelength;
  piVar3 = (int *)__archive_read_ahead(a,0x6e,&local_50);
  if (piVar3 != (int *)0x0) {
    lVar15 = 0;
    do {
      if (((char)piVar3[1] == '0' && *piVar3 == 0x37303730) &&
         ((byte)(*(char *)((long)piVar3 + 5) - 0x31U) < 2)) {
        lVar9 = -0x6e;
        while ((bVar1 = *(byte *)((long)piVar3 + lVar9 + 0x6e), (byte)(bVar1 - 0x30) < 10 ||
               ((uVar11 = bVar1 - 0x41, uVar11 < 0x26 &&
                ((0x3f0000003fU >> ((ulong)uVar11 & 0x3f) & 1) != 0))))) {
          lVar9 = lVar9 + 1;
          if (lVar9 == 0) goto LAB_003f9ca1;
        }
      }
      piVar14 = piVar3;
      if (0x6d < local_50) {
        piVar10 = piVar3;
        do {
          if (*(byte *)((long)piVar10 + 5) - 0x31 < 2) {
            lVar9 = 2;
            if ((char)piVar10[1] == '0' && *piVar10 == 0x37303730) {
              lVar12 = -0x6e;
              while ((bVar1 = *(byte *)((long)piVar10 + lVar12 + 0x6e), (byte)(bVar1 - 0x30) < 10 ||
                     ((uVar11 = bVar1 - 0x41, uVar11 < 0x26 &&
                      ((0x3f0000003fU >> ((ulong)uVar11 & 0x3f) & 1) != 0))))) {
                lVar12 = lVar12 + 1;
                if (lVar12 == 0) {
                  __archive_read_consume(a,(long)piVar10 - (long)piVar3);
                  uVar7 = ((long)piVar10 - (long)piVar3) + lVar15;
                  if (uVar7 == 0) goto LAB_003f9ca1;
                  archive_set_error(&a->archive,0,"Skipped %d bytes before finding valid header",
                                    uVar7 & 0xffffffff);
                  iVar13 = -0x14;
                  goto LAB_003f9ca4;
                }
              }
            }
          }
          else {
            lVar9 = 1;
            if (*(byte *)((long)piVar10 + 5) != 0x30) {
              lVar9 = 6;
            }
          }
          piVar14 = (int *)(lVar9 + (long)piVar10);
          uVar7 = (long)piVar10 + lVar9 + 0x6e;
          piVar10 = piVar14;
        } while (uVar7 <= (ulong)(local_50 + (long)piVar3));
      }
      __archive_read_consume(a,(long)piVar14 - (long)piVar3);
      lVar15 = lVar15 + ((long)piVar14 - (long)piVar3);
      piVar3 = (int *)__archive_read_ahead(a,0x6e,&local_50);
    } while (piVar3 != (int *)0x0);
  }
  return -0x1e;
LAB_003f9ca1:
  iVar13 = 0;
LAB_003f9ca4:
  piVar3 = (int *)__archive_read_ahead(a,0x6e,(ssize_t *)0x0);
  if (piVar3 == (int *)0x0) {
    return -0x1e;
  }
  if ((short)piVar3[1] == 0x3130 && *piVar3 == 0x37303730) {
    pcVar4 = "ASCII cpio (SVR4 with no CRC)";
    iVar8 = 0x10004;
  }
  else {
    if ((short)piVar3[1] != 0x3230 || *piVar3 != 0x37303730) goto LAB_003f9d12;
    pcVar4 = "ASCII cpio (SVR4 with CRC)";
    iVar8 = 0x10005;
  }
  (a->archive).archive_format = iVar8;
  (a->archive).archive_format_name = pcVar4;
LAB_003f9d12:
  dVar5 = atol16((char *)((long)piVar3 + 0x3e),8);
  archive_entry_set_devmajor(entry,dVar5);
  dVar5 = atol16((char *)((long)piVar3 + 0x46),8);
  archive_entry_set_devminor(entry,dVar5);
  iVar6 = atol16((char *)((long)piVar3 + 6),8);
  archive_entry_set_ino(entry,iVar6);
  iVar6 = atol16((char *)((long)piVar3 + 0xe),8);
  archive_entry_set_mode(entry,(mode_t)iVar6);
  iVar6 = atol16((char *)((long)piVar3 + 0x16),8);
  archive_entry_set_uid(entry,iVar6);
  iVar6 = atol16((char *)((long)piVar3 + 0x1e),8);
  archive_entry_set_gid(entry,iVar6);
  iVar6 = atol16((char *)((long)piVar3 + 0x26),8);
  archive_entry_set_nlink(entry,(uint)iVar6);
  dVar5 = atol16((char *)((long)piVar3 + 0x4e),8);
  archive_entry_set_rdevmajor(entry,dVar5);
  dVar5 = atol16((char *)((long)piVar3 + 0x56),8);
  archive_entry_set_rdevminor(entry,dVar5);
  iVar6 = atol16((char *)((long)piVar3 + 0x2e),8);
  archive_entry_set_mtime(entry,iVar6,0);
  uVar7 = atol16((char *)((long)piVar3 + 0x5e),8);
  *local_38 = uVar7;
  uVar7 = (ulong)(2U - (int)uVar7 & 3);
  *local_40 = uVar7;
  if (CARRY8(uVar7,*local_38)) {
    archive_set_error(&a->archive,0x54,"cpio archive has invalid namelength",uVar7 + *local_38);
    iVar13 = -0x1e;
  }
  else {
    iVar6 = atol16((char *)((long)piVar3 + 0x36),8);
    pcVar2 = local_48;
    local_48->entry_bytes_remaining = iVar6;
    archive_entry_set_size(entry,iVar6);
    pcVar2->entry_padding = (ulong)(-(int)pcVar2->entry_bytes_remaining & 3);
    __archive_read_consume(a,0x6e);
  }
  return iVar13;
}

Assistant:

static int
header_newc(struct archive_read *a, struct cpio *cpio,
    struct archive_entry *entry, size_t *namelength, size_t *name_pad)
{
	const void *h;
	const char *header;
	int r;

	r = find_newc_header(a);
	if (r < ARCHIVE_WARN)
		return (r);

	/* Read fixed-size portion of header. */
	h = __archive_read_ahead(a, newc_header_size, NULL);
	if (h == NULL)
	    return (ARCHIVE_FATAL);

	/* Parse out hex fields. */
	header = (const char *)h;

	if (memcmp(header + newc_magic_offset, "070701", 6) == 0) {
		a->archive.archive_format = ARCHIVE_FORMAT_CPIO_SVR4_NOCRC;
		a->archive.archive_format_name = "ASCII cpio (SVR4 with no CRC)";
	} else if (memcmp(header + newc_magic_offset, "070702", 6) == 0) {
		a->archive.archive_format = ARCHIVE_FORMAT_CPIO_SVR4_CRC;
		a->archive.archive_format_name = "ASCII cpio (SVR4 with CRC)";
	} else {
		/* TODO: Abort here? */
	}

	archive_entry_set_devmajor(entry,
		(dev_t)atol16(header + newc_devmajor_offset, newc_devmajor_size));
	archive_entry_set_devminor(entry, 
		(dev_t)atol16(header + newc_devminor_offset, newc_devminor_size));
	archive_entry_set_ino(entry, atol16(header + newc_ino_offset, newc_ino_size));
	archive_entry_set_mode(entry, 
		(mode_t)atol16(header + newc_mode_offset, newc_mode_size));
	archive_entry_set_uid(entry, atol16(header + newc_uid_offset, newc_uid_size));
	archive_entry_set_gid(entry, atol16(header + newc_gid_offset, newc_gid_size));
	archive_entry_set_nlink(entry,
		(unsigned int)atol16(header + newc_nlink_offset, newc_nlink_size));
	archive_entry_set_rdevmajor(entry,
		(dev_t)atol16(header + newc_rdevmajor_offset, newc_rdevmajor_size));
	archive_entry_set_rdevminor(entry,
		(dev_t)atol16(header + newc_rdevminor_offset, newc_rdevminor_size));
	archive_entry_set_mtime(entry, atol16(header + newc_mtime_offset, newc_mtime_size), 0);
	*namelength = (size_t)atol16(header + newc_namesize_offset, newc_namesize_size);
	/* Pad name to 2 more than a multiple of 4. */
	*name_pad = (2 - *namelength) & 3;

	/* Make sure that the padded name length fits into size_t. */
	if (*name_pad > SIZE_MAX - *namelength) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "cpio archive has invalid namelength");
		return (ARCHIVE_FATAL);
	}

	/*
	 * Note: entry_bytes_remaining is at least 64 bits and
	 * therefore guaranteed to be big enough for a 33-bit file
	 * size.
	 */
	cpio->entry_bytes_remaining =
	    atol16(header + newc_filesize_offset, newc_filesize_size);
	archive_entry_set_size(entry, cpio->entry_bytes_remaining);
	/* Pad file contents to a multiple of 4. */
	cpio->entry_padding = 3 & -cpio->entry_bytes_remaining;
	__archive_read_consume(a, newc_header_size);
	return (r);
}